

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall args::Group::~Group(Group *this)

{
  ~Group(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Group() {}